

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O0

string * __thiscall google::protobuf::StringPiece::ToString_abi_cxx11_(StringPiece *this)

{
  char *pcVar1;
  ulong uVar2;
  StringPiece *in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  if (in_RSI->ptr_ == (char *)0x0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    pcVar1 = data(in_RSI);
    uVar2 = size(in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

string ToString() const {
    if (ptr_ == nullptr) return string();
    return string(data(), static_cast<size_type>(size()));
  }